

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O3

matd_t * matd_inverse(matd_t *x)

{
  matd_t mVar1;
  matd_t mVar2;
  matd_t mVar3;
  matd_t mVar4;
  uint uVar5;
  matd_t *pmVar6;
  matd_plu_t *mlu;
  matd_t *pmVar7;
  double dVar8;
  
  if (x == (matd_t *)0x0) {
    __assert_fail("x != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1e4,"matd_t *matd_inverse(const matd_t *)");
  }
  uVar5 = x->nrows;
  if (uVar5 != x->ncols) {
    __assert_fail("x->nrows == x->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1e5,"matd_t *matd_inverse(const matd_t *)");
  }
  if (uVar5 < 2) {
    mVar1 = x[1];
    if (((double)mVar1 != 0.0) || (NAN((double)mVar1))) {
      pmVar6 = (matd_t *)calloc(1,0x10);
      pmVar6[1] = (matd_t)(1.0 / (double)mVar1);
      return pmVar6;
    }
  }
  else {
    if (uVar5 != 2) {
      mlu = matd_plu(x);
      if (mlu->singular == 0) {
        pmVar6 = matd_identity(x->nrows);
        pmVar7 = matd_plu_solve(mlu,pmVar6);
        if (pmVar6 != (matd_t *)0x0) {
          free(pmVar6);
        }
      }
      else {
        pmVar7 = (matd_t *)0x0;
      }
      matd_plu_destroy(mlu);
      return pmVar7;
    }
    mVar1 = x[1];
    mVar2 = x[2];
    mVar3 = x[4];
    mVar4 = x[3];
    dVar8 = (double)mVar1 * (double)mVar3 - (double)mVar4 * (double)mVar2;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar8 = 1.0 / dVar8;
      pmVar6 = (matd_t *)calloc(1,0x28);
      pmVar6->nrows = 2;
      pmVar6->ncols = 2;
      pmVar6[1] = (matd_t)((double)mVar3 * dVar8);
      pmVar6[2] = (matd_t)(-(double)mVar2 * dVar8);
      pmVar6[3] = (matd_t)(-(double)mVar4 * dVar8);
      pmVar6[4] = (matd_t)((double)mVar1 * dVar8);
      return pmVar6;
    }
  }
  return (matd_t *)0x0;
}

Assistant:

matd_t *matd_inverse(const matd_t *x)
{
    matd_t *m = NULL;

    assert(x != NULL);
    assert(x->nrows == x->ncols);

    if (matd_is_scalar(x)) {
        if (x->data[0] == 0)
            return NULL;

        return matd_create_scalar(1.0 / x->data[0]);
    }

    switch(x->nrows) {
        case 1: {
            double det = x->data[0];
            if (det == 0)
                return NULL;

            double invdet = 1.0 / det;

            m = matd_create(x->nrows, x->nrows);
            MATD_EL(m, 0, 0) = 1.0 * invdet;
            return m;
        }

        case 2: {
            double det = x->data[0] * x->data[3] - x->data[1] * x->data[2];
            if (det == 0)
                return NULL;

            double invdet = 1.0 / det;

            m = matd_create(x->nrows, x->nrows);
            MATD_EL(m, 0, 0) = MATD_EL(x, 1, 1) * invdet;
            MATD_EL(m, 0, 1) = - MATD_EL(x, 0, 1) * invdet;
            MATD_EL(m, 1, 0) = - MATD_EL(x, 1, 0) * invdet;
            MATD_EL(m, 1, 1) = MATD_EL(x, 0, 0) * invdet;
            return m;
        }

        default: {
            matd_plu_t *plu = matd_plu(x);

            matd_t *inv = NULL;
            if (!plu->singular) {
                matd_t *ident = matd_identity(x->nrows);
                inv = matd_plu_solve(plu, ident);
                matd_destroy(ident);
            }

            matd_plu_destroy(plu);

            return inv;
        }
    }

    return NULL; // unreachable
}